

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O1

int Mpm_ManNodeIfToGia(Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Int_t *vLeaves,int fHash)

{
  uint uVar1;
  Mig_Man_t *pMVar2;
  void *pvVar3;
  Vec_Ptr_t *vVisited;
  void **ppvVar4;
  int iVar5;
  Mpm_Cut_t *pMVar6;
  Mpm_Cut_t *pMVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Mpm_Man_t *format;
  
  pMVar6 = Mpm_ObjCutBestP(pMan,pObj);
  if (*(uint *)&pMVar6->field_0x4 < 0x10000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                  ,0xc2,
                  "int Mpm_ManNodeIfToGia(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Int_t *, int)")
    ;
  }
  if (0x7ffffff < *(uint *)&pMVar6->field_0x4) {
    uVar10 = 0;
    do {
      uVar1 = pMVar6->pLeaves[uVar10];
      if ((int)uVar1 < 0) goto LAB_008c691b;
      pMVar2 = pMan->pMig;
      if (pMVar2->nObjs <= (int)(uVar1 >> 1)) goto LAB_008c6959;
      if ((pMVar2->vPages).nSize <= (int)(uVar1 >> 0xd)) goto LAB_008c693a;
      pvVar3 = (pMVar2->vPages).pArray[uVar1 >> 0xd];
      if (pvVar3 == (void *)0x0) break;
      pMVar7 = Mpm_ObjCutBestP(pMan,(Mig_Obj_t *)((long)pvVar3 + (ulong)((uVar1 >> 1 & 0xfff) << 4))
                              );
      if ((long)vLeaves->nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pMVar7->hNext = vLeaves->pArray[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)&pMVar6->field_0x4 >> 0x1b);
  }
  vVisited = pMan->vTemp;
  vVisited->nSize = 0;
  format = pMan;
  iVar5 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pObj,vVisited,fHash);
  if (iVar5 == -1) {
    Abc_Print((int)pNew,(char *)format);
    iVar5 = -1;
  }
  else {
    if (0x7ffffff < *(uint *)&pMVar6->field_0x4) {
      uVar10 = 0;
      do {
        uVar1 = pMVar6->pLeaves[uVar10];
        if ((int)uVar1 < 0) {
LAB_008c691b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        pMVar2 = pMan->pMig;
        if (pMVar2->nObjs <= (int)(uVar1 >> 1)) {
LAB_008c6959:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        if ((pMVar2->vPages).nSize <= (int)(uVar1 >> 0xd)) {
LAB_008c693a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = (pMVar2->vPages).pArray[uVar1 >> 0xd];
        if (pvVar3 == (void *)0x0) break;
        pMVar7 = Mpm_ObjCutBestP(pMan,(Mig_Obj_t *)
                                      ((long)pvVar3 + (ulong)((uVar1 >> 1 & 0xfff) << 4)));
        pMVar7->hNext = 0;
        uVar10 = uVar10 + 1;
      } while (uVar10 < *(uint *)&pMVar6->field_0x4 >> 0x1b);
    }
    lVar8 = (long)pMan->vTemp->nSize;
    if (0 < lVar8) {
      ppvVar4 = pMan->vTemp->pArray;
      lVar9 = 0;
      do {
        *(undefined4 *)ppvVar4[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  }
  return iVar5;
}

Assistant:

int Mpm_ManNodeIfToGia( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Int_t * vLeaves, int fHash )
{
    Mpm_Cut_t * pCut;
    Mig_Obj_t * pFanin;
    int i, iRes;
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pMan->vTemp );
    iRes = Mpm_ManNodeIfToGia_rec( pNew, pMan, pObj, pMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Mpm_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), 0 );
    Vec_PtrForEachEntry( Mpm_Cut_t *, pMan->vTemp, pCut, i )
        Mpm_CutSetDataInt( pCut, 0 );
    return iRes;
}